

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerProfiledLdFld(Lowerer *this,JitProfilingInstr *ldFldInstr)

{
  OpCode OVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  Opnd *this_00;
  SymOpnd *pSVar5;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  PropertySymOpnd *pPVar8;
  IntConstOpnd *pIVar9;
  Opnd *opndArg;
  HelperCallOpnd *newSrc;
  Opnd *src2;
  JnHelperMethod helper;
  Opnd *src;
  Instr *instrPrev;
  JitProfilingInstr *ldFldInstr_local;
  Lowerer *this_local;
  
  pIVar2 = (ldFldInstr->super_Instr).m_prev;
  this_00 = IR::Instr::UnlinkSrc1(&ldFldInstr->super_Instr);
  bVar4 = IR::Opnd::IsSymOpnd(this_00);
  if (bVar4) {
    pSVar5 = IR::Opnd::AsSymOpnd(this_00);
    bVar4 = Sym::IsPropertySym(pSVar5->m_sym);
    if (!bVar4) goto LAB_007bcaf9;
  }
  else {
LAB_007bcaf9:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1637,"(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym())",
                       "Expected property sym as src");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  src2._4_4_ = HelperInvalid;
  OVar1 = (ldFldInstr->super_Instr).m_opcode;
  if (OVar1 == LdFld) {
    src2._4_4_ = HelperProfiledLdFld;
  }
  else if (OVar1 == LdFldForTypeOf) {
    src2._4_4_ = HelperProfiledLdFldForTypeOf;
  }
  else if (OVar1 == LdFldForCallApplyTarget) {
    src2._4_4_ = HelperProfiledLdFld_CallApplyTarget;
  }
  else if (OVar1 == LdRootFld) {
    src2._4_4_ = HelperProfiledLdRootFld;
  }
  else if (OVar1 == LdMethodFld) {
    src2._4_4_ = HelperProfiledLdMethodFld;
  }
  else if (OVar1 == LdRootMethodFld) {
    src2._4_4_ = HelperProfiledLdRootMethodFld;
  }
  else {
    if (OVar1 == LdLen_A) {
      if (ldFldInstr->profileId == 0xffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1682,"(ldFldInstr->profileId != Js::Constants::NoProfileId)",
                           "ldFldInstr->profileId != Js::Constants::NoProfileId");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pRVar7 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
      LowererMD::LoadHelperArgument(&this->m_lowererMD,&ldFldInstr->super_Instr,&pRVar7->super_Opnd)
      ;
      pIVar9 = IR::Opnd::CreateProfileIdOpnd(ldFldInstr->profileId,this->m_func);
      LowererMD::LoadHelperArgument(&this->m_lowererMD,&ldFldInstr->super_Instr,&pIVar9->super_Opnd)
      ;
      pPVar8 = IR::Opnd::AsPropertySymOpnd(this_00);
      pIVar9 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar8->m_inlineCacheIndex,this->m_func);
      LowererMD::LoadHelperArgument(&this->m_lowererMD,&ldFldInstr->super_Instr,&pIVar9->super_Opnd)
      ;
      LoadPropertySymAsArgument(this,&ldFldInstr->super_Instr,this_00);
      src2._4_4_ = HelperProfiledLdLen;
      goto LAB_007bd049;
    }
    if (OVar1 == LdSuperFld) {
      if (ldFldInstr->profileId != 0xffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1668,"(ldFldInstr->profileId == Js::Constants::NoProfileId)",
                           "ldFldInstr->profileId == Js::Constants::NoProfileId");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      opndArg = IR::Instr::UnlinkSrc2(&ldFldInstr->super_Instr);
      LowererMD::LoadHelperArgument(&this->m_lowererMD,&ldFldInstr->super_Instr,opndArg);
      pRVar7 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
      LowererMD::LoadHelperArgument(&this->m_lowererMD,&ldFldInstr->super_Instr,&pRVar7->super_Opnd)
      ;
      pPVar8 = IR::Opnd::AsPropertySymOpnd(this_00);
      pIVar9 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar8->m_inlineCacheIndex,this->m_func);
      LowererMD::LoadHelperArgument(&this->m_lowererMD,&ldFldInstr->super_Instr,&pIVar9->super_Opnd)
      ;
      LoadPropertySymAsArgument(this,&ldFldInstr->super_Instr,this_00);
      src2._4_4_ = HelperProfiledLdSuperFld;
      goto LAB_007bd049;
    }
    if (OVar1 != LdRootFldForTypeOf) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1695,"(false)","false");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      goto LAB_007bd049;
    }
    src2._4_4_ = HelperProfiledLdRootFldForTypeOf;
  }
  if (ldFldInstr->profileId != 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1654,"(ldFldInstr->profileId == Js::Constants::NoProfileId)",
                       "ldFldInstr->profileId == Js::Constants::NoProfileId");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pRVar7 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&ldFldInstr->super_Instr,&pRVar7->super_Opnd);
  pPVar8 = IR::Opnd::AsPropertySymOpnd(this_00);
  pIVar9 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar8->m_inlineCacheIndex,this->m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&ldFldInstr->super_Instr,&pIVar9->super_Opnd);
  LoadPropertySymAsArgument(this,&ldFldInstr->super_Instr,this_00);
LAB_007bd049:
  newSrc = IR::HelperCallOpnd::New(src2._4_4_,this->m_func);
  IR::Instr::SetSrc1(&ldFldInstr->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(&this->m_lowererMD,&ldFldInstr->super_Instr,0);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerProfiledLdFld(IR::JitProfilingInstr *ldFldInstr)
{
    const auto instrPrev = ldFldInstr->m_prev;

    auto src = ldFldInstr->UnlinkSrc1();
    AssertMsg(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as src");

    IR::JnHelperMethod helper = IR::HelperInvalid;
    switch (ldFldInstr->m_opcode)
    {
        case Js::OpCode::LdFld:
            helper = IR::HelperProfiledLdFld;
            goto ldFldCommon;
        case Js::OpCode::LdRootFld:
            helper = IR::HelperProfiledLdRootFld;
            goto ldFldCommon;
        case Js::OpCode::LdMethodFld:
            helper = IR::HelperProfiledLdMethodFld;
            goto ldFldCommon;
        case Js::OpCode::LdRootMethodFld:
            helper = IR::HelperProfiledLdRootMethodFld;
            goto ldFldCommon;
        case Js::OpCode::LdFldForCallApplyTarget:
            helper = IR::HelperProfiledLdFld_CallApplyTarget;
            goto ldFldCommon;
        case Js::OpCode::LdFldForTypeOf:
            helper = IR::HelperProfiledLdFldForTypeOf;
            goto ldFldCommon;
        case Js::OpCode::LdRootFldForTypeOf:
            helper = IR::HelperProfiledLdRootFldForTypeOf;
            goto ldFldCommon;

ldFldCommon:
        {
            Assert(ldFldInstr->profileId == Js::Constants::NoProfileId);

            /*
                Var ProfilingHelpers::ProfiledLdFld_Jit(
                    const Var instance,
                    const PropertyId propertyId,
                    const InlineCacheIndex inlineCacheIndex,
                    void *const framePointer)
            */

            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateFramePointerOpnd(m_func));
            m_lowererMD.LoadHelperArgument(
                ldFldInstr,
                IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));
            LoadPropertySymAsArgument(ldFldInstr, src);
            break;
        }

        case Js::OpCode::LdSuperFld:
        {
            Assert(ldFldInstr->profileId == Js::Constants::NoProfileId);

            IR::Opnd * src2 = nullptr;

            /*
                Var ProfilingHelpers::ProfiledLdSuperFld_Jit(
                    const Var instance,
                    const PropertyId propertyId,
                    const InlineCacheIndex inlineCacheIndex,
                    void *const framePointer,
                    const Var thisInstance)
            */

            src2 = ldFldInstr->UnlinkSrc2();

            m_lowererMD.LoadHelperArgument(ldFldInstr, src2 );
            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateFramePointerOpnd(m_func));
            m_lowererMD.LoadHelperArgument(
                ldFldInstr,
                IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));
            LoadPropertySymAsArgument(ldFldInstr, src);
            helper = IR::HelperProfiledLdSuperFld;
            break;
        }

        case Js::OpCode::LdLen_A:
            Assert(ldFldInstr->profileId != Js::Constants::NoProfileId);

            /*
                Var ProfilingHelpers::ProfiledLdLen_Jit(
                    const Var instance,
                    const PropertyId propertyId,
                    const InlineCacheIndex inlineCacheIndex,
                    const ProfileId profileId,
                    void *const framePointer)
            */

            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateFramePointerOpnd(m_func));
            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateProfileIdOpnd(ldFldInstr->profileId, m_func));
            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));
            LoadPropertySymAsArgument(ldFldInstr, src);
            helper = IR::HelperProfiledLdLen;
            break;

        default:
            Assert(false);
    }

    ldFldInstr->SetSrc1(IR::HelperCallOpnd::New(helper, m_func));
    m_lowererMD.LowerCall(ldFldInstr, 0);

    return instrPrev;
}